

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

void duckdb::TupleDataCollection::InitializeChunkState
               (TupleDataChunkState *chunk_state,vector<duckdb::LogicalType,_true> *types,
               vector<unsigned_long,_true> *column_ids)

{
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_true>
  *this_00;
  bool bVar1;
  const_reference type;
  Allocator *args;
  reference this_01;
  type args_00;
  size_type *psVar2;
  duckdb local_68 [8];
  TupleDataChunkState *local_60;
  vector<unsigned_long,_true> *local_58;
  size_type *local_50;
  LogicalType cast_type;
  
  if ((column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GetAllColumnIDsInternal
              (column_ids,
               ((long)(types->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                     ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  }
  InitializeVectorFormat(&chunk_state->vector_data,types);
  this = &chunk_state->cached_cast_vectors;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ::clear(&this->
           super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
         );
  this_00 = &chunk_state->cached_cast_vector_cache;
  local_60 = chunk_state;
  ::std::
  vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
  ::clear(&this_00->
           super_vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
         );
  local_50 = (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_58 = column_ids;
  for (psVar2 = (column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; psVar2 != local_50; psVar2 = psVar2 + 1) {
    type = vector<duckdb::LogicalType,_true>::get<true>(types,*psVar2);
    bVar1 = TypeVisitor::Contains(type,ARRAY);
    if (bVar1) {
      ArrayType::ConvertToList(&cast_type,type);
      args = Allocator::DefaultAllocator();
      make_uniq<duckdb::VectorCache,duckdb::Allocator&,duckdb::LogicalType&>
                (local_68,args,&cast_type);
      ::std::
      vector<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>,std::allocator<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>
                ((vector<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>,std::allocator<duckdb::unique_ptr<duckdb::VectorCache,std::default_delete<duckdb::VectorCache>,true>>>
                  *)this_00,
                 (unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true> *)
                 local_68);
      ::std::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>_>::~unique_ptr
                ((unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>_> *)
                 local_68);
      this_01 = vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_true>
                ::back(this_00);
      args_00 = unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>::
                operator*(this_01);
      make_uniq<duckdb::Vector,duckdb::VectorCache&>(local_68,args_00);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                  *)this,(unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                         local_68);
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)local_68);
      LogicalType::~LogicalType(&cast_type);
    }
    else {
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ::emplace_back<>(&this->
                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                      );
      ::std::
      vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
      ::emplace_back<>(&this_00->
                        super_vector<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::VectorCache,_std::default_delete<duckdb::VectorCache>,_true>_>_>
                      );
    }
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60->column_ids,local_58
            );
  return;
}

Assistant:

void TupleDataCollection::InitializeChunkState(TupleDataChunkState &chunk_state, const vector<LogicalType> &types,
                                               vector<column_t> column_ids) {
	if (column_ids.empty()) {
		GetAllColumnIDsInternal(column_ids, types.size());
	}
	InitializeVectorFormat(chunk_state.vector_data, types);

	chunk_state.cached_cast_vectors.clear();
	chunk_state.cached_cast_vector_cache.clear();
	for (auto &col : column_ids) {
		auto &type = types[col];
		if (TypeVisitor::Contains(type, LogicalTypeId::ARRAY)) {
			auto cast_type = ArrayType::ConvertToList(type);
			chunk_state.cached_cast_vector_cache.push_back(
			    make_uniq<VectorCache>(Allocator::DefaultAllocator(), cast_type));
			chunk_state.cached_cast_vectors.push_back(make_uniq<Vector>(*chunk_state.cached_cast_vector_cache.back()));
		} else {
			chunk_state.cached_cast_vectors.emplace_back();
			chunk_state.cached_cast_vector_cache.emplace_back();
		}
	}

	chunk_state.column_ids = std::move(column_ids);
}